

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

bool kratos::LatchVisitor::IfVisitor::has_var(Var *var,Var *target)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  VarSlice *slice;
  undefined4 extraout_var;
  _func_int **local_30;
  pointer local_28;
  
  if (var->type_ == Slice) {
    iVar3 = (*(var->super_IRNode)._vptr_IRNode[0x29])(var);
    var = (Var *)CONCAT44(extraout_var,iVar3);
  }
  else if (var->type_ == Expression) {
    Var::as<kratos::Expr>((Var *)&stack0xffffffffffffffd0);
    if (local_28 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    }
    bVar1 = has_var((Var *)local_30[0x4f],target);
    if ((Var *)local_30[0x50] == (Var *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = has_var((Var *)local_30[0x50],target);
    }
    return (bool)(bVar1 | bVar2);
  }
  return var == target;
}

Assistant:

bool static has_var(Var* var, Var* target) {
            if (var->type() == VarType::Expression) {
                auto* expr = var->as<Expr>().get();
                bool left = has_var(expr->left, target);
                bool right = expr->right ? has_var(expr->right, target) : false;
                return left || right;
            } else {
                if (var->type() == VarType::Slice) {
                    auto* slice = reinterpret_cast<VarSlice*>(var);
                    var = const_cast<Var*>(slice->get_var_root_parent());
                }
                return var == target;
            }
        }